

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void MOJOSHADER_freePreshader(MOJOSHADER_preshader *preshader)

{
  void *d_00;
  MOJOSHADER_free local_28;
  MOJOSHADER_free f;
  void *d;
  uint j;
  uint i;
  MOJOSHADER_preshader *preshader_local;
  
  if (preshader != (MOJOSHADER_preshader *)0x0) {
    d_00 = preshader->malloc_data;
    local_28 = preshader->free;
    if (local_28 == (MOJOSHADER_free)0x0) {
      local_28 = MOJOSHADER_internal_free;
    }
    (*local_28)(preshader->literals,d_00);
    for (d._4_4_ = 0; d._4_4_ < preshader->instruction_count; d._4_4_ = d._4_4_ + 1) {
      for (d._0_4_ = 0; (uint)d < preshader->instructions[d._4_4_].operand_count;
          d._0_4_ = (uint)d + 1) {
        (*local_28)(preshader->instructions[d._4_4_].operands[(uint)d].array_registers,d_00);
      }
    }
    (*local_28)(preshader->instructions,d_00);
    (*local_28)(preshader->registers,d_00);
    free_symbols(local_28,d_00,preshader->symbols,preshader->symbol_count);
    (*local_28)(preshader,d_00);
  }
  return;
}

Assistant:

void MOJOSHADER_freePreshader(const MOJOSHADER_preshader *preshader)
{
    if (preshader != NULL)
    {
        unsigned int i, j;
        void *d = preshader->malloc_data;
        MOJOSHADER_free f = preshader->free;
        if (f == NULL) f = MOJOSHADER_internal_free;

        f((void *) preshader->literals, d);
        for (i = 0; i < preshader->instruction_count; i++)
        {
            for (j = 0; j < preshader->instructions[i].operand_count; j++)
                f((void *) preshader->instructions[i].operands[j].array_registers, d);
        } // for
        f((void *) preshader->instructions, d);
        f((void *) preshader->registers, d);
        free_symbols(f, d, preshader->symbols, preshader->symbol_count);
        f((void *) preshader, d);
    } // if
}